

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sampleIsBetterPost(Stat4Accum *pAccum,Stat4Sample *pNew,Stat4Sample *pOld)

{
  int local_30;
  int i;
  int nCol;
  Stat4Sample *pOld_local;
  Stat4Sample *pNew_local;
  Stat4Accum *pAccum_local;
  
  local_30 = pNew->iCol;
  while( true ) {
    local_30 = local_30 + 1;
    if (pAccum->nCol <= local_30) {
      if (pOld->iHash < pNew->iHash) {
        return 1;
      }
      return 0;
    }
    if (pOld->anEq[local_30] < pNew->anEq[local_30]) break;
    if (pNew->anEq[local_30] < pOld->anEq[local_30]) {
      return 0;
    }
  }
  return 1;
}

Assistant:

static int sampleIsBetterPost(
  Stat4Accum *pAccum, 
  Stat4Sample *pNew, 
  Stat4Sample *pOld
){
  int nCol = pAccum->nCol;
  int i;
  assert( pNew->iCol==pOld->iCol );
  for(i=pNew->iCol+1; i<nCol; i++){
    if( pNew->anEq[i]>pOld->anEq[i] ) return 1;
    if( pNew->anEq[i]<pOld->anEq[i] ) return 0;
  }
  if( pNew->iHash>pOld->iHash ) return 1;
  return 0;
}